

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream_decoder.c
# Opt level: O2

lzma_ret stream_decoder_memconfig
                   (lzma_coder_conflict1 *coder,uint64_t *memusage,uint64_t *old_memlimit,
                   uint64_t new_memlimit)

{
  *memusage = coder->memusage;
  *old_memlimit = coder->memlimit;
  if (new_memlimit != 0) {
    if (new_memlimit < coder->memusage) {
      return LZMA_MEMLIMIT_ERROR;
    }
    coder->memlimit = new_memlimit;
  }
  return LZMA_OK;
}

Assistant:

static lzma_ret
stream_decoder_memconfig(lzma_coder *coder, uint64_t *memusage,
		uint64_t *old_memlimit, uint64_t new_memlimit)
{
	*memusage = coder->memusage;
	*old_memlimit = coder->memlimit;

	if (new_memlimit != 0) {
		if (new_memlimit < coder->memusage)
			return LZMA_MEMLIMIT_ERROR;

		coder->memlimit = new_memlimit;
	}

	return LZMA_OK;
}